

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_partial
              (char *src,char *dst,int compressedSize,int targetOutputSize,int dstCapacity)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  long lVar9;
  ulong uVar10;
  ushort *puVar11;
  ushort *__src;
  ushort *puVar12;
  ulong uVar13;
  size_t __n;
  char *pcVar14;
  int iVar15;
  BYTE *d;
  char *pcVar16;
  char *__dest;
  BYTE *d_1;
  BYTE *s;
  int local_68;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar15 = -1;
  if (-1 < dstCapacity && src != (char *)0x0) {
    if (dstCapacity == 0) {
      iVar15 = 0;
    }
    else if (compressedSize != 0) {
      pbVar1 = (byte *)(src + compressedSize);
      pcVar2 = dst + (uint)dstCapacity;
      __dest = dst;
      puVar12 = (ushort *)src;
LAB_00109cf3:
      do {
        __src = (ushort *)((long)puVar12 + 1);
        bVar3 = (byte)*puVar12;
        uVar10 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          if (pbVar1 + -0xf <= __src) goto LAB_00109fe0;
          puVar12 = puVar12 + 1;
          lVar9 = 0;
          puVar11 = __src;
          do {
            __src = (ushort *)((long)puVar11 + 1);
            if (pbVar1 + -0xf < __src) goto LAB_00109fe0;
            uVar7 = *puVar11;
            lVar9 = lVar9 + (ulong)(byte)uVar7;
            puVar12 = (ushort *)((long)puVar12 + 1);
            puVar11 = __src;
          } while ((ulong)(byte)uVar7 == 0xff);
          if (((lVar9 == -1) || (uVar10 = lVar9 + 0xf, CARRY8((ulong)__dest,uVar10))) ||
             ((ulong)-(long)puVar12 < uVar10)) goto LAB_00109fe0;
LAB_00109d63:
          pcVar16 = __dest + uVar10;
          if ((pcVar2 + -0xc < pcVar16) ||
             (puVar12 = (ushort *)((long)__src + uVar10), pbVar1 + -8 < puVar12)) {
            pcVar14 = pcVar16;
            if (pbVar1 < (byte *)((long)__src + uVar10)) {
              pcVar14 = __dest + ((long)pbVar1 - (long)__src);
              uVar10 = (long)pbVar1 - (long)__src;
            }
            __n = (long)pcVar2 - (long)__dest;
            if (pcVar14 <= pcVar2) {
              __n = uVar10;
            }
            memmove(__dest,__src,__n);
            pcVar16 = __dest + __n;
            if ((pcVar2 <= pcVar14) ||
               (puVar12 = (ushort *)((long)__src + __n), pbVar1 + -2 <= puVar12)) break;
          }
          else {
            do {
              *(undefined8 *)__dest = *(undefined8 *)__src;
              __dest = __dest + 8;
              __src = __src + 4;
            } while (__dest < pcVar16);
          }
          uVar7 = *puVar12;
          __src = puVar12 + 1;
          pcVar14 = pcVar16 + -(ulong)uVar7;
          uVar13 = (ulong)(bVar3 & 0xf);
        }
        else {
          if ((src + (long)compressedSize + -0x10 <= __src) ||
             (dst + ((ulong)(uint)dstCapacity - 0x20) < __dest)) goto LAB_00109d63;
          uVar6 = *(undefined8 *)((long)puVar12 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar6;
          pcVar16 = __dest + uVar10;
          uVar13 = (ulong)(bVar3 & 0xf);
          puVar12 = (ushort *)((long)__src + uVar10);
          __src = puVar12 + 1;
          uVar7 = *puVar12;
          pcVar14 = pcVar16 + -(ulong)uVar7;
          if (((uVar13 != 0xf) && (7 < uVar7)) && (dst <= pcVar14)) {
            *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
            *(undefined8 *)(pcVar16 + 8) = *(undefined8 *)(pcVar14 + 8);
            *(undefined2 *)(pcVar16 + 0x10) = *(undefined2 *)(pcVar14 + 0x10);
            __dest = pcVar16 + uVar13 + 4;
            puVar12 = __src;
            goto LAB_00109cf3;
          }
        }
        if ((int)uVar13 == 0xf) {
          lVar9 = 0;
          puVar12 = __src;
          do {
            __src = (ushort *)((long)puVar12 + 1);
            if (pbVar1 + -4 < __src) goto LAB_00109fe0;
            uVar8 = *puVar12;
            lVar9 = lVar9 + (ulong)(byte)uVar8;
            puVar12 = __src;
          } while ((ulong)(byte)uVar8 == 0xff);
          uVar13 = lVar9 + 0xf;
          if ((lVar9 == -1) || (CARRY8((ulong)pcVar16,uVar13))) goto LAB_00109fe0;
        }
        if (pcVar14 < dst) {
LAB_00109fe0:
          local_68 = (int)src;
          return ~(uint)__src + local_68;
        }
        uVar13 = uVar13 + 4;
        __dest = pcVar16 + uVar13;
        puVar12 = __src;
        if (__dest <= pcVar2 + -0xc) {
          if (uVar7 < 8) {
            pcVar16[0] = '\0';
            pcVar16[1] = '\0';
            pcVar16[2] = '\0';
            pcVar16[3] = '\0';
            *pcVar16 = *pcVar14;
            pcVar16[1] = pcVar14[1];
            pcVar16[2] = pcVar14[2];
            pcVar16[3] = pcVar14[3];
            uVar5 = inc32table[uVar7];
            *(undefined4 *)(pcVar16 + 4) = *(undefined4 *)(pcVar14 + uVar5);
            pcVar14 = pcVar14 + ((ulong)uVar5 - (long)dec64table[uVar7]);
          }
          else {
            *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
            pcVar14 = pcVar14 + 8;
          }
          *(undefined8 *)(pcVar16 + 8) = *(undefined8 *)pcVar14;
          if (0x10 < uVar13) {
            pcVar16 = pcVar16 + 0x10;
            do {
              pcVar14 = pcVar14 + 8;
              *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
              pcVar16 = pcVar16 + 8;
            } while (pcVar16 < __dest);
          }
          goto LAB_00109cf3;
        }
        uVar10 = (long)pcVar2 - (long)pcVar16;
        if (uVar13 < (ulong)((long)pcVar2 - (long)pcVar16)) {
          uVar10 = uVar13;
        }
        __dest = pcVar16 + uVar10;
        if (pcVar16 < pcVar14 + uVar10) {
          for (; pcVar16 < __dest; pcVar16 = pcVar16 + 1) {
            cVar4 = *pcVar14;
            pcVar14 = pcVar14 + 1;
            *pcVar16 = cVar4;
          }
        }
        else {
          memcpy(pcVar16,pcVar14,uVar10);
        }
        pcVar16 = pcVar2;
      } while (__dest != pcVar2);
      iVar15 = (int)pcVar16 - (int)dst;
    }
  }
  return iVar15;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial(const char* src, char* dst, int compressedSize, int targetOutputSize, int dstCapacity)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(src, dst, compressedSize, dstCapacity,
                                  partial_decode,
                                  noDict, (BYTE*)dst, NULL, 0);
}